

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

bool __thiscall AActor::FixMapthingPos(AActor *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  sector_t *psVar4;
  line_t *li;
  MetaClass *pMVar5;
  char *pcVar6;
  double dVar7;
  double dVar8;
  char *local_148;
  TAngle<double> local_118 [2];
  DVector3 local_108;
  undefined1 local_f0 [32];
  undefined1 local_d0 [24];
  DAngle ang;
  vertex_t *local_b0;
  undefined1 local_a8 [24];
  double distance;
  side_t *local_80;
  double linelen;
  divline_t dlv;
  divline_t dll;
  line_t *ldef;
  int *list;
  bool success;
  int blocky;
  int blockx;
  sector_t *secstart;
  AActor *this_local;
  
  dVar7 = X(this);
  dVar8 = Y(this);
  psVar4 = P_PointInSectorBuggy(dVar7,dVar8);
  dVar7 = X(this);
  uVar2 = GetBlockX(dVar7);
  dVar7 = Y(this);
  uVar3 = GetBlockY(dVar7);
  list._7_1_ = false;
  if ((uVar2 < (uint)bmapwidth) && (uVar3 < (uint)bmapheight)) {
    ldef = (line_t *)(blockmaplump + blockmap[(int)(uVar3 * bmapwidth + uVar2)]);
    while (ldef = (line_t *)((long)&ldef->v1 + 4), *(int *)&ldef->v1 != -1) {
      li = lines + *(int *)&ldef->v1;
      if ((((li->frontsector != li->backsector) &&
           ((((li->backsector == (sector_t *)0x0 ||
              (bVar1 = secplane_t::operator==
                                 (&li->frontsector->floorplane,&li->backsector->floorplane), !bVar1)
              ) || (bVar1 = secplane_t::operator==
                                      (&li->frontsector->ceilingplane,&li->backsector->ceilingplane)
                   , !bVar1)) &&
            ((dVar7 = X(this), li->bbox[2] < dVar7 + this->radius &&
             (dVar7 = X(this), dVar7 - this->radius < li->bbox[3])))))) &&
          (dVar7 = Y(this), li->bbox[1] < dVar7 + this->radius)) &&
         (dVar7 = Y(this), dVar7 - this->radius < li->bbox[0])) {
        line_t::Delta((line_t *)&distance);
        local_80 = (side_t *)TVector2<double>::Length((TVector2<double> *)&distance);
        P_MakeDivline(li,(divline_t *)&dlv.dy);
        linelen = X(this);
        dlv.x = Y(this);
        dlv.y = dll.dx / (double)local_80;
        dlv.dx = -dll.y / (double)local_80;
        local_a8._16_8_ = P_InterceptVector((divline_t *)&linelen,(divline_t *)&dlv.dy);
        local_a8._16_8_ = ABS((double)local_a8._16_8_);
        if ((double)local_a8._16_8_ < this->radius) {
          pMVar5 = GetClass(this);
          pcVar6 = FName::GetChars(&(pMVar5->super_PClass).super_PStruct.super_PNamedType.TypeName);
          dVar7 = X(this);
          dVar8 = Y(this);
          line_t::Delta((line_t *)local_a8);
          if (((double)local_a8._0_8_ != 0.0) || (NAN((double)local_a8._0_8_))) {
            line_t::Delta((line_t *)&ang);
            local_148 = "diagonal";
            if ((double)local_b0 == 0.0) {
              local_148 = "horizontal";
            }
          }
          else {
            local_148 = "vertical";
          }
          DPrintf(3,"%s at (%f,%f) lies on %s line %td, distance = %f\n",dVar7,SUB84(dVar8,0),
                  local_a8._16_8_,pcVar6,local_148,((long)li - (long)lines) / 0x98);
          line_t::Delta((line_t *)local_d0);
          TVector2<double>::Angle((TVector2<double> *)(local_d0 + 0x10));
          if ((li->backsector == (sector_t *)0x0) || (li->backsector != psVar4)) {
            TAngle<double>::operator-=((TAngle<double> *)(local_d0 + 0x10),90.0);
          }
          else {
            TAngle<double>::operator+=((TAngle<double> *)(local_d0 + 0x10),90.0);
          }
          local_a8._16_8_ = this->radius - (double)local_a8._16_8_;
          Pos(&local_108,this);
          TVector3<double>::XY((TVector3<double> *)local_f0);
          TAngle<double>::ToVector(local_118,(double)local_a8._16_8_);
          TVector2<double>::operator+
                    ((TVector2<double> *)(local_f0 + 0x10),(TVector2<double> *)local_f0);
          SetXY(this,(DVector2 *)(local_f0 + 0x10));
          ClearInterpolation(this);
          list._7_1_ = true;
        }
      }
    }
  }
  return list._7_1_;
}

Assistant:

bool AActor::FixMapthingPos()
{
	sector_t *secstart = P_PointInSectorBuggy(X(), Y());

	int blockx = GetBlockX(X());
	int blocky = GetBlockY(Y());
	bool success = false;

	if ((unsigned int)blockx < (unsigned int)bmapwidth &&
		(unsigned int)blocky < (unsigned int)bmapheight)
	{
		int *list;

		for (list = blockmaplump + blockmap[blocky*bmapwidth + blockx] + 1; *list != -1; ++list)
		{
			line_t *ldef = &lines[*list];

			if (ldef->frontsector == ldef->backsector)
			{ // Skip two-sided lines inside a single sector
				continue;
			}
			if (ldef->backsector != NULL)
			{
				if (ldef->frontsector->floorplane == ldef->backsector->floorplane &&
					ldef->frontsector->ceilingplane == ldef->backsector->ceilingplane)
				{ // Skip two-sided lines without any height difference on either side
					continue;
				}
			}

			// Not inside the line's bounding box
			if (X() + radius <= ldef->bbox[BOXLEFT]
				|| X() - radius >= ldef->bbox[BOXRIGHT]
				|| Y() + radius <= ldef->bbox[BOXBOTTOM]
				|| Y() - radius >= ldef->bbox[BOXTOP])
				continue;

			// Get the exact distance to the line
			divline_t dll, dlv;
			double linelen = ldef->Delta().Length();

			P_MakeDivline(ldef, &dll);

			dlv.x = X();
			dlv.y = Y();
			dlv.dx = dll.dy / linelen;
			dlv.dy = -dll.dx / linelen;

			double distance = fabs(P_InterceptVector(&dlv, &dll));

			if (distance < radius)
			{
				DPrintf(DMSG_NOTIFY, "%s at (%f,%f) lies on %s line %td, distance = %f\n",
					this->GetClass()->TypeName.GetChars(), X(), Y(),
					ldef->Delta().X == 0 ? "vertical" : ldef->Delta().Y == 0 ? "horizontal" : "diagonal",
					ldef - lines, distance);
				DAngle ang = ldef->Delta().Angle();
				if (ldef->backsector != NULL && ldef->backsector == secstart)
				{
					ang += 90.;
				}
				else
				{
					ang -= 90.;
				}

				// Get the distance we have to move the object away from the wall
				distance = radius - distance;
				SetXY(Pos().XY() + ang.ToVector(distance));
				ClearInterpolation();
				success = true;
			}
		}
	}
	return success;
}